

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::set_texcoord
          (ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,
          VertexHandle _vh,Vec2f *_texcoord)

{
  bool bVar1;
  BaseHandle in_ESI;
  AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
  *in_RDI;
  TexCoord2D *_t;
  
  bVar1 = AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
          ::has_vertex_texcoords2D
                    ((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                      *)0x1bb025);
  if (bVar1) {
    _t = *(TexCoord2D **)&(in_RDI->super_PolyConnectivity).field_0x8;
    vector_cast<OpenMesh::VectorT<float,2>,OpenMesh::VectorT<float,2>>
              ((VectorT<float,_2> *)0x1bb04b);
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::set_texcoord2D(in_RDI,(VertexHandle)in_ESI.idx_,_t);
  }
  return;
}

Assistant:

virtual void set_texcoord(VertexHandle _vh, const Vec2f& _texcoord) override
  {
    if (mesh_.has_vertex_texcoords2D())
      mesh_.set_texcoord2D(_vh, vector_cast<TexCoord2D>(_texcoord));
  }